

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

ssize_t __thiscall
serial::Serial::SerialImpl::write(SerialImpl *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  PortNotOpenedException *this_00;
  int *piVar2;
  IOException *pIVar3;
  SerialException *pSVar4;
  long lVar5;
  undefined4 in_register_00000034;
  allocator<char> local_159;
  string local_158;
  ssize_t local_138;
  ssize_t bytes_written_now;
  string local_128;
  int local_104;
  size_t *psStack_100;
  int r;
  fd_set *__arr;
  undefined1 auStack_f0 [4];
  uint __i;
  timespec timeout;
  int64_t timeout_remaining_ms;
  undefined1 local_d0 [7];
  bool first_iteration;
  MillisecondTimer total_timeout;
  long total_timeout_ms;
  size_t bytes_written;
  fd_set writefds;
  size_t length_local;
  uint8_t *data_local;
  SerialImpl *this_local;
  
  if ((this->is_open_ & 1U) == 0) {
    this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x48);
    PortNotOpenedException::PortNotOpenedException(this_00,"Serial::write");
    __cxa_throw(this_00,&PortNotOpenedException::typeinfo,
                PortNotOpenedException::~PortNotOpenedException);
  }
  total_timeout_ms = 0;
  total_timeout.expiry.tv_nsec =
       (ulong)(this->timeout_).write_timeout_multiplier * (long)__buf +
       (ulong)(this->timeout_).write_timeout_constant;
  MillisecondTimer::MillisecondTimer
            ((MillisecondTimer *)local_d0,(uint32_t)total_timeout.expiry.tv_nsec);
  bVar1 = true;
  do {
    do {
      while( true ) {
        if ((__buf <= (ulong)total_timeout_ms) ||
           ((timeout.tv_nsec = MillisecondTimer::remaining((MillisecondTimer *)local_d0), !bVar1 &&
            (timeout.tv_nsec < 1)))) {
          return total_timeout_ms;
        }
        bVar1 = false;
        _auStack_f0 = timespec_from_ms((uint32_t)timeout.tv_nsec);
        psStack_100 = &bytes_written;
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          psStack_100[__arr._4_4_] = 0;
        }
        lVar5 = (long)(this->fd_ / 0x40);
        writefds.fds_bits[lVar5 + -1] =
             1L << ((byte)((long)this->fd_ % 0x40) & 0x3f) | writefds.fds_bits[lVar5 + -1];
        local_104 = pselect(this->fd_ + 1,(fd_set *)0x0,(fd_set *)&bytes_written,(fd_set *)0x0,
                            (timespec *)auStack_f0,(__sigset_t *)0x0);
        if (-1 < local_104) break;
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          bytes_written_now._6_1_ = 1;
          pIVar3 = (IOException *)__cxa_allocate_exception(0x78);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                     ,(allocator<char> *)((long)&bytes_written_now + 7));
          piVar2 = __errno_location();
          IOException::IOException(pIVar3,&local_128,0x28a,*piVar2);
          bytes_written_now._6_1_ = 0;
          __cxa_throw(pIVar3,&IOException::typeinfo,IOException::~IOException);
        }
      }
      if (local_104 == 0) {
        return total_timeout_ms;
      }
    } while (local_104 < 1);
    if ((writefds.fds_bits[(long)(this->fd_ / 0x40) + -1] &
        1L << ((byte)((long)this->fd_ % 0x40) & 0x3f)) == 0) goto LAB_00113678;
    local_138 = ::write(this->fd_,(void *)(CONCAT44(in_register_00000034,__fd) + total_timeout_ms),
                        (long)__buf - total_timeout_ms);
    if (local_138 < 1) {
      pSVar4 = (SerialException *)__cxa_allocate_exception(0x28);
      SerialException::SerialException
                (pSVar4,
                 "device reports readiness to write but returned no data (device disconnected?)");
      __cxa_throw(pSVar4,&SerialException::typeinfo,SerialException::~SerialException);
    }
    total_timeout_ms = local_138 + total_timeout_ms;
    if ((void *)total_timeout_ms == __buf) {
      return (ssize_t)(void *)total_timeout_ms;
    }
  } while ((ulong)total_timeout_ms < __buf);
  if (__buf < (ulong)total_timeout_ms) {
    pSVar4 = (SerialException *)__cxa_allocate_exception(0x28);
    SerialException::SerialException
              (pSVar4,
               "write over wrote, too many bytes where written, this shouldn\'t happen, might be a logical error!"
              );
    __cxa_throw(pSVar4,&SerialException::typeinfo,SerialException::~SerialException);
  }
LAB_00113678:
  pIVar3 = (IOException *)__cxa_allocate_exception(0x78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
             ,&local_159);
  IOException::IOException
            (pIVar3,&local_158,0x2b3,
             "select reports ready to write, but our fd isn\'t in the list, this shouldn\'t happen!"
            );
  __cxa_throw(pIVar3,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

size_t
Serial::SerialImpl::write (const uint8_t *data, size_t length)
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::write");
  }
  fd_set writefds;
  size_t bytes_written = 0;

  // Calculate total timeout in milliseconds t_c + (t_m * N)
  long total_timeout_ms = timeout_.write_timeout_constant;
  total_timeout_ms += timeout_.write_timeout_multiplier * static_cast<long> (length);
  MillisecondTimer total_timeout(total_timeout_ms);

  bool first_iteration = true;
  while (bytes_written < length) {
    int64_t timeout_remaining_ms = total_timeout.remaining();
    // Only consider the timeout if it's not the first iteration of the loop
    // otherwise a timeout of 0 won't be allowed through
    if (!first_iteration && (timeout_remaining_ms <= 0)) {
      // Timed out
      break;
    }
    first_iteration = false;

    timespec timeout(timespec_from_ms(timeout_remaining_ms));

    FD_ZERO (&writefds);
    FD_SET (fd_, &writefds);

    // Do the select
    int r = pselect (fd_ + 1, NULL, &writefds, NULL, &timeout, NULL);

    // Figure out what happened by looking at select's response 'r'
    /** Error **/
    if (r < 0) {
      // Select was interrupted, try again
      if (errno == EINTR) {
        continue;
      }
      // Otherwise there was some error
      THROW (IOException, errno);
    }
    /** Timeout **/
    if (r == 0) {
      break;
    }
    /** Port ready to write **/
    if (r > 0) {
      // Make sure our file descriptor is in the ready to write list
      if (FD_ISSET (fd_, &writefds)) {
        // This will write some
        ssize_t bytes_written_now =
          ::write (fd_, data + bytes_written, length - bytes_written);
        // write should always return some data as select reported it was
        // ready to write when we get to this point.
        if (bytes_written_now < 1) {
          // Disconnected devices, at least on Linux, show the
          // behavior that they are always ready to write immediately
          // but writing returns nothing.
          throw SerialException ("device reports readiness to write but "
                                 "returned no data (device disconnected?)");
        }
        // Update bytes_written
        bytes_written += static_cast<size_t> (bytes_written_now);
        // If bytes_written == size then we have written everything we need to
        if (bytes_written == length) {
          break;
        }
        // If bytes_written < size then we have more to write
        if (bytes_written < length) {
          continue;
        }
        // If bytes_written > size then we have over written, which shouldn't happen
        if (bytes_written > length) {
          throw SerialException ("write over wrote, too many bytes where "
                                 "written, this shouldn't happen, might be "
                                 "a logical error!");
        }
      }
      // This shouldn't happen, if r > 0 our fd has to be in the list!
      THROW (IOException, "select reports ready to write, but our fd isn't"
                          " in the list, this shouldn't happen!");
    }
  }
  return bytes_written;
}